

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SpectrumPtexTexture::Evaluate
          (SpectrumPtexTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  int iVar1;
  SampledSpectrum SVar2;
  float local_48 [2];
  Float local_40;
  RGB local_38;
  RGBReflectanceSpectrum local_2c;
  
  iVar1 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,local_48);
  if (iVar1 == 1) {
    SVar2.values.values[2] = local_48[0];
    SVar2.values.values[3] = local_48[0];
    SVar2.values.values[0] = local_48[0];
    SVar2.values.values[1] = local_48[0];
  }
  else {
    local_38.b = local_40;
    RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_2c,RGBColorSpace::sRGB,&local_38);
    SVar2 = RGBReflectanceSpectrum::Sample(&local_2c,&lambda);
  }
  return (array<float,_4>)(array<float,_4>)SVar2;
}

Assistant:

SampledSpectrum SpectrumPtexTexture::Evaluate(TextureEvalContext ctx,
                                              SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return SampledSpectrum(0);
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return SampledSpectrum(result[0]);
    DCHECK_EQ(3, nc);
    return RGBReflectanceSpectrum(*RGBColorSpace::sRGB,
                                  RGB(result[0], result[1], result[2]))
        .Sample(lambda);
#endif
}